

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table-utils.h
# Opt level: O3

void __thiscall wasm::TableUtils::FlatTable::FlatTable(FlatTable *this,Module *wasm,Table *table)

{
  char *pcVar1;
  pointer puVar2;
  ElementSegment *segment_00;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar3;
  anon_class_16_2_f8897cbb local_40;
  
  (this->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->valid = true;
  pcVar1 = (table->super_Importable).super_Named.name.super_IString.str._M_str;
  local_40.this = this;
  local_40.table = table;
  if (pcVar1 != (char *)0x0) {
    puVar3 = (wasm->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (wasm->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar3 != puVar2) {
      do {
        segment_00 = (puVar3->_M_t).
                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (*(char **)((long)&(segment_00->table).super_IString + 8) == pcVar1) {
          FlatTable::anon_class_16_2_f8897cbb::operator()(&local_40,segment_00);
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != puVar2);
    }
    return;
  }
  __assert_fail("table.is() && \"Table name must not be null\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x85,
                "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/table-utils.h:36:25)]"
               );
}

Assistant:

FlatTable(Module& wasm, Table& table) {
    valid = true;
    ModuleUtils::iterTableSegments(
      wasm, table.name, [&](ElementSegment* segment) {
        auto offset = segment->offset;
        if (!offset->is<Const>() || !segment->type.isFunction()) {
          // TODO: handle some non-constant segments
          valid = false;
          return;
        }
        Index start = offset->cast<Const>()->value.getInteger();
        Index size = segment->data.size();
        Index end;
        if (std::ckd_add(&end, start, size) || end > table.initial) {
          // Overflow.
          valid = false;
          return;
        }
        if (end > names.size()) {
          names.resize(end);
        }
        ElementUtils::iterElementSegmentFunctionNames(
          segment, [&](Name entry, Index i) { names[start + i] = entry; });
      });
  }